

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  func;
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  
  func.super__Function_base._M_functor._8_8_ = 0;
  func.super__Function_base._M_functor._M_unused._M_object = Function;
  func._M_invoker =
       std::
       _Function_handler<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  pIVar1 = (ILogger *)operator_new(0x28);
  std::
  function<void_(liblogger::LogType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_38,&func);
  liblogger::LogFunction::LogFunction((LogFunction *)pIVar1,&local_38);
  liblogger::LogManager::Add(pIVar1);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  liblogger::LogManager::RemoveAll();
  std::_Function_base::~_Function_base(&func.super__Function_base);
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	std::function<void(const LogType, const std::string &)> func = Function;
	LogManager::Add(new LogFunction(func));

	examples();

	LogManager::RemoveAll();
	return 0;
}